

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

int __thiscall despot::Parser::NumInitialStates(Parser *this)

{
  int iVar1;
  size_type sVar2;
  reference this_00;
  const_reference pvVar3;
  double dVar4;
  double extraout_XMM0_Qa;
  uint local_28;
  int local_24;
  int v;
  int n;
  int s;
  int num_states;
  Parser *this_local;
  
  dVar4 = LogNumInitialStates(this);
  if (dVar4 <= 30.0) {
    n = 1;
    v = 0;
    while( true ) {
      sVar2 = std::vector<despot::StateVar,_std::allocator<despot::StateVar>_>::size
                        (&this->prev_state_vars_);
      if (sVar2 <= (ulong)(long)v) break;
      local_24 = 0;
      local_28 = 0;
      while( true ) {
        this_00 = std::vector<despot::StateVar,_std::allocator<despot::StateVar>_>::operator[]
                            (&this->prev_state_vars_,(long)v);
        iVar1 = Variable::Size((Variable *)this_00);
        if (iVar1 <= (int)local_28) break;
        pvVar3 = std::vector<despot::TabularCPT,_std::allocator<despot::TabularCPT>_>::operator[]
                           (&this->initial_belief_funcs_,(long)v);
        (*(pvVar3->super_CPT).super_Function._vptr_Function[4])(pvVar3,0,(ulong)local_28);
        local_24 = (uint)(0.0 < extraout_XMM0_Qa) + local_24;
        local_28 = local_28 + 1;
      }
      n = local_24 * n;
      v = v + 1;
    }
    this_local._4_4_ = n;
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int Parser::NumInitialStates() const {
	if (LogNumInitialStates() > 30) {
		return -1;
	} else {
		int num_states = 1;

		for (int s = 0; s < prev_state_vars_.size(); s++) {
			int n = 0;
			for (int v = 0; v < prev_state_vars_[s].Size(); v++)
				n += (initial_belief_funcs_[s].GetValue(0, v) > 0);
			num_states *= n;
		}

		return num_states;
	}
}